

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedNumberFormat::format
          (RuleBasedNumberFormat *this,double number,NFRuleSet *rs,UnicodeString *toAppendTo,
          UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  RoundingMode roundingMode;
  undefined1 local_88 [8];
  DecimalQuantity digitList;
  int32_t startPos;
  UErrorCode *status_local;
  UnicodeString *toAppendTo_local;
  NFRuleSet *rs_local;
  double number_local;
  RuleBasedNumberFormat *this_local;
  
  digitList._76_4_ = UnicodeString::length(toAppendTo);
  iVar2 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x22])();
  rs_local = (NFRuleSet *)number;
  if (iVar2 != 7) {
    UVar1 = uprv_isNaN_63(number);
    if (UVar1 == '\0') {
      UVar1 = uprv_isInfinite_63(number);
      if (UVar1 == '\0') {
        icu_63::number::impl::DecimalQuantity::DecimalQuantity((DecimalQuantity *)local_88);
        icu_63::number::impl::DecimalQuantity::setToDouble((DecimalQuantity *)local_88,number);
        iVar3 = NumberFormat::getMaximumFractionDigits(&this->super_NumberFormat);
        roundingMode = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x22])
                                 ();
        icu_63::number::impl::DecimalQuantity::roundToMagnitude
                  ((DecimalQuantity *)local_88,-iVar3,roundingMode,status);
        rs_local = (NFRuleSet *)
                   icu_63::number::impl::DecimalQuantity::toDouble((DecimalQuantity *)local_88);
        icu_63::number::impl::DecimalQuantity::~DecimalQuantity((DecimalQuantity *)local_88);
      }
    }
  }
  iVar3 = UnicodeString::length(toAppendTo);
  NFRuleSet::format(rs,(double)rs_local,toAppendTo,iVar3,0,status);
  adjustForCapitalizationContext(this,digitList._76_4_,toAppendTo,status);
  return;
}

Assistant:

void
RuleBasedNumberFormat::format(double number,
                              NFRuleSet& rs,
                              UnicodeString& toAppendTo,
                              UErrorCode& status) const
{
    int32_t startPos = toAppendTo.length();
    if (getRoundingMode() != DecimalFormat::ERoundingMode::kRoundUnnecessary && !uprv_isNaN(number) && !uprv_isInfinite(number)) {
        DecimalQuantity digitList;
        digitList.setToDouble(number);
        digitList.roundToMagnitude(
                -getMaximumFractionDigits(),
                static_cast<UNumberFormatRoundingMode>(getRoundingMode()),
                status);
        number = digitList.toDouble();
    }
    rs.format(number, toAppendTo, toAppendTo.length(), 0, status);
    adjustForCapitalizationContext(startPos, toAppendTo, status);
}